

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShapeBuilder.cpp
# Opt level: O2

Shape * OpenMD::ShapeBuilder::internalCreateShape(Atom *atom)

{
  AtomType *this;
  RealType RVar1;
  bool bVar2;
  int atomicnum;
  Sphere *this_00;
  pointer ppAVar3;
  LennardJonesAdapter lja;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> atChain;
  string local_b8 [32];
  string local_98;
  string local_78 [32];
  Vector3d local_58;
  Vector3d local_40;
  
  this = atom->atomType_;
  lja.at_ = this;
  bVar2 = LennardJonesAdapter::isLennardJones(&lja);
  if (bVar2) {
    this_00 = (Sphere *)operator_new(0x48);
    StuntDouble::getPos(&local_40,&atom->super_StuntDouble);
    RVar1 = LennardJonesAdapter::getSigma(&lja);
    Sphere::Sphere(this_00,&local_40,RVar1 * 0.5);
    (*(atom->super_StuntDouble)._vptr_StuntDouble[7])(local_78,atom);
    std::__cxx11::string::_M_assign((string *)&(this_00->super_Shape).name_);
    std::__cxx11::string::~string(local_78);
  }
  else {
    AtomType::allYourBase(&atChain,this);
    ppAVar3 = atChain.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      if (ppAVar3 ==
          atChain.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        builtin_strncpy(painCave.errMsg + 0x20,"ult element.txt\n",0x11);
        builtin_strncpy(painCave.errMsg + 0x10,"tom type in defa",0x10);
        builtin_strncpy(painCave.errMsg,"Could not find a",0x10);
        painCave.isFatal = 1;
        painCave.severity = 1;
        simError();
        this_00 = (Sphere *)0x0;
        goto LAB_0016e4de;
      }
      AtomType::getName_abi_cxx11_(&local_98,*ppAVar3);
      atomicnum = ElementsTable::GetAtomicNum((ElementsTable *)etab,local_98._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_98);
      ppAVar3 = ppAVar3 + 1;
    } while (atomicnum == 0);
    this_00 = (Sphere *)operator_new(0x48);
    StuntDouble::getPos(&local_58,&atom->super_StuntDouble);
    RVar1 = ElementsTable::GetVdwRad((ElementsTable *)etab,atomicnum);
    Sphere::Sphere(this_00,&local_58,RVar1);
    (*(atom->super_StuntDouble)._vptr_StuntDouble[7])(local_b8,atom);
    std::__cxx11::string::_M_assign((string *)&(this_00->super_Shape).name_);
    std::__cxx11::string::~string(local_b8);
LAB_0016e4de:
    std::_Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::~_Vector_base
              (&atChain.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>)
    ;
  }
  return &this_00->super_Shape;
}

Assistant:

Shape* ShapeBuilder::internalCreateShape(Atom* atom) {
    AtomType* atomType      = atom->getAtomType();
    Shape* currShape        = NULL;
    LennardJonesAdapter lja = LennardJonesAdapter(atomType);
    if (lja.isLennardJones()) {
      currShape = new Sphere(atom->getPos(), lja.getSigma() / 2.0);
      currShape->setName(atom->getType());
    } else {
      int obanum(0);
      std::vector<AtomType*> atChain = atomType->allYourBase();
      std::vector<AtomType*>::iterator i;
      for (i = atChain.begin(); i != atChain.end(); ++i) {
        obanum = etab.GetAtomicNum((*i)->getName().c_str());
        if (obanum != 0) {
          currShape = new Sphere(atom->getPos(), etab.GetVdwRad(obanum));
          currShape->setName(atom->getType());
          break;
        }
      }
      if (obanum == 0) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Could not find atom type in default element.txt\n");
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      }
    }
    return currShape;
  }